

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_timer_node.cpp
# Opt level: O3

void __thiscall
decorator_timer_node_timer_true_Test::~decorator_timer_node_timer_true_Test
          (decorator_timer_node_timer_true_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(decorator_timer_node, timer_true) {
  test_generator gen;
  auto root = gen.generate(
    "<bhvr_tree class = \"decorator_timer_node\" duration = \"1.5\">"
      "<bhvr_tree class = \"true_node\"/>"
    "</bhvr_tree>"
  );
  ASSERT_NE(nullptr, root);

  test_agent agent;
  EXPECT_EQ(0, agent.get_true_counter());
  EXPECT_EQ(0, agent.get_false_counter());

  test_agent_proxy ap(agent);
  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_FALSE(result);
    EXPECT_EQ(0, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });

  std::this_thread::sleep_for(std::chrono::seconds(1));

  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_FALSE(result);
    EXPECT_EQ(0, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });

  std::this_thread::sleep_for(std::chrono::milliseconds(500));

  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_TRUE(result);
    EXPECT_EQ(1, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });

  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_FALSE(result);
    EXPECT_EQ(1, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });
}